

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_impl.h
# Opt level: O2

int64_t safe_add_int64_int32(int64_t a,int32_t b)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = b + a;
  if (a < 0) {
    bVar3 = -1 < b;
    bVar1 = lVar2 <= a;
  }
  else {
    bVar3 = b < 0;
    bVar1 = a <= lVar2;
  }
  if (bVar1 || bVar3) {
    return lVar2;
  }
  safe_math_fail("safe_math_fail safe_add_int64_int32");
}

Assistant:

static inline int64_t safe_add_int64_int32(int64_t a, int32_t b)
{
    int64_t tmp = (int64_t)((uint64_t)a + (uint64_t)b);

    if (a >= 0)
    {
        // mixed sign cannot overflow
        if (b >= 0 && tmp < a)
            safe_math_fail("safe_math_fail safe_add_int64_int32");
    }
    else
    {
        // lhs negative
        if (b < 0 && tmp > a)
            safe_math_fail("safe_math_fail safe_add_int64_int32");
    }

    return tmp;
}